

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::ReduceL1LayerParams::_InternalSerialize
          (ReduceL1LayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedField<long> *this_00;
  LogMessage *other;
  long *plVar4;
  byte *pbVar5;
  uint64_t uVar6;
  uint8_t *puVar7;
  void *data;
  long *plVar8;
  int byte_size;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ReduceL1LayerParams *this_local;
  memory_order __b;
  long *end;
  long *it;
  EpsCopyOutputStream *local_f0;
  EpsCopyOutputStream *local_c8;
  ulong local_c0;
  EpsCopyOutputStream *local_b8;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  int local_3c;
  EpsCopyOutputStream *local_38;
  byte *local_30;
  uint local_24;
  byte *local_20;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->_axes_cached_byte_size_).super___atomic_base<int>._M_i;
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar1) {
    this_00 = _internal_axes(this);
    local_48 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_3c = 1;
    local_40 = 2;
    local_81 = 0;
    local_38 = stream;
    if (stream->end_ <= local_48) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_81 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_80,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_95,other);
    }
    if ((local_81 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_80);
    }
    local_24 = local_3c << 3 | local_40;
    local_30 = local_48;
    *local_48 = (byte)local_24;
    if (local_24 < 0x80) {
      local_20 = local_48 + 1;
    }
    else {
      *local_48 = *local_48 | 0x80;
      local_24 = local_24 >> 7;
      local_48[1] = (byte)local_24;
      if (local_24 < 0x80) {
        local_20 = local_48 + 2;
      }
      else {
        local_30 = local_48 + 2;
        do {
          local_30[-1] = local_30[-1] | 0x80;
          local_24 = local_24 >> 7;
          *local_30 = (byte)local_24;
          local_30 = local_30 + 1;
          local_20 = local_30;
        } while (0x7f < local_24);
      }
    }
    local_18 = (EpsCopyOutputStream *)local_20;
    for (local_c = uVar1; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_f0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_18 = local_f0;
    plVar4 = google::protobuf::RepeatedField<long>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<long>::size(this_00);
    end = plVar4;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_f0);
      plVar8 = end + 1;
      uVar6 = google::protobuf::io::EpsCopyOutputStream::Encode64(*end);
      *pbVar5 = (byte)uVar6;
      if (uVar6 < 0x80) {
        local_b8 = (EpsCopyOutputStream *)(pbVar5 + 1);
      }
      else {
        *pbVar5 = *pbVar5 | 0x80;
        local_c0 = uVar6 >> 7;
        pbVar5[1] = (byte)local_c0;
        if (local_c0 < 0x80) {
          local_b8 = (EpsCopyOutputStream *)(pbVar5 + 2);
        }
        else {
          local_c8 = (EpsCopyOutputStream *)(pbVar5 + 2);
          do {
            local_c8[-1].field_0x3f = local_c8[-1].field_0x3f | 0x80;
            local_c0 = local_c0 >> 7;
            *(byte *)&local_c8->end_ = (byte)local_c0;
            local_c8 = (EpsCopyOutputStream *)((long)&local_c8->end_ + 1);
            local_b8 = local_c8;
          } while (0x7f < local_c0);
        }
      }
      local_f0 = local_b8;
      end = plVar8;
    } while (plVar8 < plVar4 + iVar3);
    stream_local = local_b8;
  }
  bVar2 = _internal_keepdims(this);
  if (bVar2) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar2 = _internal_keepdims(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(2,bVar2,puVar7);
  }
  bVar2 = _internal_reduceall(this);
  if (bVar2) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar2 = _internal_reduceall(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteBoolToArray(3,bVar2,puVar7);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ReduceL1LayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ReduceL1LayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  {
    int byte_size = _axes_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_axes(), byte_size, target);
    }
  }

  // bool keepDims = 2;
  if (this->_internal_keepdims() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_keepdims(), target);
  }

  // bool reduceAll = 3;
  if (this->_internal_reduceall() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_reduceall(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ReduceL1LayerParams)
  return target;
}